

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O2

bool __thiscall Minisat::SimpSolver::implied(SimpSolver *this,vec<Minisat::Lit,_int> *c)

{
  lbool lVar1;
  bool bVar2;
  undefined4 in_EAX;
  CRef CVar3;
  long lVar4;
  undefined4 uStack_38;
  Size local_34;
  
  if ((this->super_Solver).trail_lim.sz != 0) {
    __assert_fail("decisionLevel() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/luciferxiaozhi[P]VertexCover_CNFSAT_/minisat/minisat/simp/SimpSolver.cc"
                  ,0x142,"bool Minisat::SimpSolver::implied(const vec<Lit> &)");
  }
  _uStack_38 = CONCAT44((this->super_Solver).trail.sz,in_EAX);
  vec<int,_int>::push(&(this->super_Solver).trail_lim,&local_34);
  lVar4 = 0;
  do {
    if (c->sz <= lVar4) {
      CVar3 = Solver::propagate(&this->super_Solver);
      bVar2 = CVar3 != 0xffffffff;
LAB_001110e6:
      Solver::cancelUntil(&this->super_Solver,0);
      return bVar2;
    }
    lVar1 = Solver::value(&this->super_Solver,(Lit)c->data[lVar4].x);
    uStack_38 = CONCAT13(lVar1.value,(undefined3)uStack_38);
    bVar2 = lbool::operator==((lbool *)((long)&uStack_38 + 3),l_True);
    if (bVar2) {
      bVar2 = true;
      goto LAB_001110e6;
    }
    lVar1 = Solver::value(&this->super_Solver,(Lit)c->data[lVar4].x);
    uStack_38._0_3_ = CONCAT12(lVar1.value,(undefined2)uStack_38);
    bVar2 = lbool::operator!=((lbool *)((long)&uStack_38 + 2),l_False);
    if (bVar2) {
      lVar1 = Solver::value(&this->super_Solver,(Lit)c->data[lVar4].x);
      uStack_38._0_2_ = CONCAT11(lVar1.value,(undefined1)uStack_38);
      bVar2 = lbool::operator==((lbool *)((long)&uStack_38 + 1),l_Undef);
      if (!bVar2) {
        __assert_fail("value(c[i]) == l_Undef",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/luciferxiaozhi[P]VertexCover_CNFSAT_/minisat/minisat/simp/SimpSolver.cc"
                      ,0x14a,"bool Minisat::SimpSolver::implied(const vec<Lit> &)");
      }
      Solver::uncheckedEnqueue(&this->super_Solver,(Lit)(c->data[lVar4].x ^ 1),0xffffffff);
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

bool SimpSolver::implied(const vec<Lit>& c)
{
    assert(decisionLevel() == 0);

    trail_lim.push(trail.size());
    for (int i = 0; i < c.size(); i++)
        if (value(c[i]) == l_True){
            cancelUntil(0);
            return true;
        }else if (value(c[i]) != l_False){
            assert(value(c[i]) == l_Undef);
            uncheckedEnqueue(~c[i]);
        }

    bool result = propagate() != CRef_Undef;
    cancelUntil(0);
    return result;
}